

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall KktCheck::chPrimalFeas(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  ostream *poVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  
  this->i = 0;
  if (0 < this->numRow) {
    iVar5 = 0;
    bVar7 = true;
    do {
      lVar8 = (long)iVar5;
      piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = piVar1[lVar8];
      lVar9 = (long)iVar10;
      this->k = iVar10;
      dVar12 = 0.0;
      if (iVar10 < piVar1[lVar8 + 1]) {
        piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar10 = iVar10 + 1;
          dVar12 = dVar12 + pdVar4[piVar2[lVar9]] * pdVar3[lVar9];
          lVar9 = lVar9 + 1;
          this->k = iVar10;
        } while (lVar9 < piVar1[lVar8 + 1]);
      }
      dVar11 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
      if ((dVar12 < dVar11) &&
         (dVar11 = ABS(dVar12 - dVar11), this->tol <= dVar11 && dVar11 != this->tol)) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," infeasible: Row value=",0x17);
          poVar6 = std::ostream::_M_insert<double>(dVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  L=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  U=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          iVar5 = this->i;
          lVar8 = (long)iVar5;
        }
        bVar7 = false;
      }
      dVar11 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
      if ((dVar11 < dVar12) &&
         (dVar11 = ABS(dVar12 - dVar11), this->tol <= dVar11 && dVar11 != this->tol)) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Row ",4);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," infeasible: Row value=",0x17);
          poVar6 = std::ostream::_M_insert<double>(dVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  L=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  U=",4);
          poVar6 = std::ostream::_M_insert<double>
                             ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          iVar5 = this->i;
        }
        bVar7 = false;
      }
      iVar5 = iVar5 + 1;
      this->i = iVar5;
    } while (iVar5 < this->numRow);
    if (!bVar7) {
      if (this->print == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KKT check error: Primal infeasible.\n",0x24);
      }
      this->istrueGlb = true;
      return;
    }
  }
  if (this->print != 1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Primal feasible.\n",0x11);
  return;
}

Assistant:

void KktCheck::chPrimalFeas() {
	bool istrue = true;
	double rowV;
	//Ax = b
	for (i=0; i<numRow;i++) {
		rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++) 
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		if ( ((rowV-rowLower[i]) < 0) && (abs(rowV-rowLower[i]) > tol)) {
			if (print == 1) 
				cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
				//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
			istrue = false;
		}

		if ( ((rowV-rowUpper[i]) > 0) && (abs(rowV-rowUpper[i]) > tol)) {
					if (print == 1)
						cout<<"Row "<<rIndexRev[i]<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
						//cout<<"Row "<<i<<" infeasible: Row value="<<rowV<<"  L="<<rowLower[i]<<"  U="<<rowUpper[i]<<endl;
					istrue = false;
				}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Primal feasible.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Primal infeasible.\n";
		istrueGlb = true;
	}

}